

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  java *this_00;
  java *pjVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  __type _Var3;
  java jVar4;
  LogMessage *pLVar5;
  pointer ppFVar6;
  mapped_type *this_01;
  byte bVar7;
  java *pjVar8;
  pointer ppFVar9;
  FieldDescriptor *pFVar10;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field_00;
  AlphaNum *a;
  AlphaNum *a_00;
  FieldDescriptor *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *__rhs;
  ulong uVar11;
  FieldDescriptor *__n;
  java *this_02;
  reference rVar12;
  FieldDescriptor *field;
  Context *local_210;
  pointer local_208;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_200;
  FieldGeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  reference local_160;
  FieldDescriptor *local_130;
  ulong local_128;
  long local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<bool,_std::allocator<bool>_> is_conflict;
  string local_70;
  string local_50;
  
  local_210 = this;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&is_conflict,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&info);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&conflict_reason,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&info);
  uVar11 = 1;
  __n = (FieldDescriptor *)0x0;
  local_200 = fields;
  do {
    ppFVar6 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppFVar9 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    pFVar10 = (FieldDescriptor *)((long)ppFVar9 - (long)ppFVar6 >> 3);
    if (pFVar10 <= __n) {
      local_210 = (Context *)&local_210->field_generator_info_map_;
      for (uVar11 = 0; uVar11 < (ulong)((long)ppFVar9 - (long)ppFVar6 >> 3); uVar11 = uVar11 + 1) {
        field = ppFVar6[uVar11];
        info.name._M_string_length = 0;
        info.name._M_dataplus._M_p = (pointer)&info.name.field_2;
        info.name.field_2._M_local_buf[0] = '\0';
        info.capitalized_name._M_dataplus._M_p = (pointer)&info.capitalized_name.field_2;
        info.capitalized_name._M_string_length = 0;
        info.capitalized_name.field_2._M_local_buf[0] = '\0';
        info.disambiguated_reason._M_dataplus._M_p = (pointer)&info.disambiguated_reason.field_2;
        info.disambiguated_reason._M_string_length = 0;
        info.disambiguated_reason.field_2._M_local_buf[0] = '\0';
        CamelCaseFieldName_abi_cxx11_((string *)&local_160,(java *)field,pFVar10);
        std::__cxx11::string::operator=((string *)&info,(string *)&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        UnderscoresToCapitalizedCamelCase_abi_cxx11_((string *)&local_160,(java *)field,field_00);
        std::__cxx11::string::operator=((string *)&info.capitalized_name,(string *)&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,uVar11);
        if ((*rVar12._M_p & rVar12._M_mask) != 0) {
          strings::AlphaNum::AlphaNum((AlphaNum *)&local_160,*(int *)(field + 4));
          StrCat_abi_cxx11_(&local_180,(protobuf *)&local_160,a);
          std::__cxx11::string::append((string *)&info);
          std::__cxx11::string::~string((string *)&local_180);
          strings::AlphaNum::AlphaNum((AlphaNum *)&local_160,*(int *)(field + 4));
          StrCat_abi_cxx11_(&local_180,(protobuf *)&local_160,a_00);
          std::__cxx11::string::append((string *)&info.capitalized_name);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::_M_assign((string *)&info.disambiguated_reason);
        }
        this_01 = std::
                  map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
                  ::operator[]((map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
                                *)local_210,&field);
        FieldGeneratorInfo::operator=(this_01,&info);
        FieldGeneratorInfo::~FieldGeneratorInfo(&info);
        ppFVar6 = (local_200->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppFVar9 = (local_200->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pFVar10 = extraout_RDX_01;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&conflict_reason);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&is_conflict.super__Bvector_base<std::allocator<bool>_>);
      return;
    }
    this_00 = (java *)ppFVar6[(long)__n];
    UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_50,this_00,pFVar10);
    local_130 = __n + 1;
    pFVar10 = extraout_RDX;
    local_128 = uVar11;
    while( true ) {
      ppFVar6 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(fields->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3) <= uVar11)
      break;
      this_02 = (java *)ppFVar6[uVar11];
      UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_70,this_02,pFVar10);
      _Var3 = std::operator==(&local_50,&local_70);
      if (_Var3) {
        info.name._0_16_ = std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,uVar11)
        ;
        *info.name._M_dataplus._M_p = *info.name._M_dataplus._M_p | info.name._M_string_length;
        local_160 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              (&is_conflict,(size_type)__n);
        std::_Bit_reference::operator=(&local_160,(_Bit_reference *)&info);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
                       "capitalized name of field \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this_00 + 8));
        std::operator+(&local_180,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
                       "\" conflicts with field \"");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_160,&local_180,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (this_02 + 8));
        std::operator+(&info.name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_160,"\"");
        std::__cxx11::string::operator=
                  ((string *)
                   (conflict_reason.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar11),(string *)&info);
        std::__cxx11::string::_M_assign
                  ((string *)
                   (conflict_reason.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)__n));
        std::__cxx11::string::~string((string *)&info);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&field);
      }
      else {
        local_120 = uVar11 * 0x20;
        local_208 = conflict_reason.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar11;
        jVar4 = this_00[1];
        pjVar1 = this_00;
        pbVar2 = &local_50;
        __rhs = &local_70;
        do {
          __lhs = pbVar2;
          pjVar8 = pjVar1;
          bVar7 = ~(byte)jVar4;
          jVar4 = this_02[1];
          if ((bVar7 & 0x60) == 0) {
            if (((byte)jVar4 & 0x60) == 0x60) break;
            std::operator+(&info.name,__lhs,"Count");
            _Var3 = std::operator==(&info.name,__rhs);
            std::__cxx11::string::~string((string *)&info);
            if (_Var3) {
              std::operator+(&local_118,"both repeated field \"",
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (pjVar8 + 8));
              std::operator+(&local_f8,&local_118,"\" and singular ");
              std::operator+(&local_d8,&local_f8,"field \"");
              std::operator+(&local_b8,&local_d8,
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (this_02 + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &field,&local_b8,"\" generate the method \"");
              std::operator+(&local_180,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &field,"get");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_160,&local_180,__lhs);
              std::operator+(&info.name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_160,"Count()\"");
            }
            else {
              std::operator+(&info.name,__lhs,"List");
              _Var3 = std::operator==(&info.name,__rhs);
              std::__cxx11::string::~string((string *)&info);
              if (!_Var3) break;
              std::operator+(&local_118,"both repeated field \"",
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (pjVar8 + 8));
              std::operator+(&local_f8,&local_118,"\" and singular ");
              std::operator+(&local_d8,&local_f8,"field \"");
              std::operator+(&local_b8,&local_d8,
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (this_02 + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &field,&local_b8,"\" generate the method \"");
              std::operator+(&local_180,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &field,"get");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_160,&local_180,__lhs);
              std::operator+(&info.name,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_160,"List()\"");
            }
            std::__cxx11::string::operator=((string *)local_208,(string *)&info);
            std::__cxx11::string::~string((string *)&info);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&field);
            std::__cxx11::string::~string((string *)&local_b8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_118);
            info.name._0_16_ =
                 std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,uVar11);
            *info.name._M_dataplus._M_p = *info.name._M_dataplus._M_p | info.name._M_string_length;
            local_160 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  (&is_conflict,(size_type)__n);
            std::_Bit_reference::operator=(&local_160,(_Bit_reference *)&info);
            std::__cxx11::string::_M_assign
                      ((string *)
                       (conflict_reason.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)__n));
            break;
          }
          pjVar1 = this_02;
          pbVar2 = __rhs;
          __rhs = __lhs;
          this_02 = pjVar8;
        } while (((byte)jVar4 & 0x60) == 0x60);
      }
      std::__cxx11::string::~string((string *)&local_70);
      uVar11 = uVar11 + 1;
      pFVar10 = extraout_RDX_00;
      fields = local_200;
    }
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_conflict,(size_type)__n);
    uVar11 = local_128;
    if ((*rVar12._M_p & rVar12._M_mask) != 0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&info,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_context.cc"
                 ,0x96);
      pLVar5 = internal::LogMessage::operator<<((LogMessage *)&info,"field \"");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,(string *)(*(long *)(this_00 + 8) + 0x20));
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"\" is conflicting ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"with another field: ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,conflict_reason.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + (long)__n);
      internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)&info);
    }
    std::__cxx11::string::~string((string *)&local_50);
    uVar11 = uVar11 + 1;
    __n = local_130;
  } while( true );
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = UnderscoresToCapitalizedCamelCase(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = UnderscoresToCapitalizedCamelCase(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            "capitalized name of field \"" + field->name() +
            "\" conflicts with field \"" + other->name() + "\"";
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      GOOGLE_LOG(WARNING) << "field \"" << field->full_name() << "\" is conflicting "
                   << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = UnderscoresToCapitalizedCamelCase(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      info.name += StrCat(field->number());
      info.capitalized_name += StrCat(field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    field_generator_info_map_[field] = info;
  }
}